

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventplayer.cxx
# Opt level: O2

void __thiscall EventPlayer::EventPlayer(EventPlayer *this,EventPlayer *ep)

{
  Time *time;
  uint uVar1;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  time = (ep->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
         super_TimeDependent.xTime;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_61);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"Event Generator",&local_62);
  StochasticEventGenerator::StochasticEventGenerator
            (&this->super_StochasticEventGenerator,time,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Parametric._vptr_Parametric = (_func_int **)&PTR__EventPlayer_00154f10;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_TimeDependent._vptr_TimeDependent = (_func_int **)&PTR__EventPlayer_00154fa8;
  (this->super_StochasticEventGenerator).super_StochasticVariable.super_StochasticProcess.
  super_Physical._vptr_Physical = (_func_int **)&PTR__EventPlayer_00154ff0;
  (this->playerFileName)._M_dataplus._M_p = (pointer)&(this->playerFileName).field_2;
  (this->playerFileName)._M_string_length = 0;
  (this->playerFileName).field_2._M_local_buf[0] = '\0';
  (this->playerBuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->playerBuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->playerBuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::operator=(&this->playerBuffer,&ep->playerBuffer);
  uVar1 = ep->playerCurrentValue;
  this->playerBufferPosition = ep->playerBufferPosition;
  this->playerCurrentValue = uVar1;
  this->playerNextValue = ep->playerNextValue;
  return;
}

Assistant:

EventPlayer::EventPlayer( const EventPlayer &ep )
	: StochasticEventGenerator(ep.xTime)
{
	playerBuffer = ep.playerBuffer;
	playerBufferPosition = ep.playerBufferPosition;
	playerCurrentValue = ep.playerCurrentValue;
	playerNextValue = ep.playerNextValue;
}